

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::FocusWindowEvent,QWindow*,Qt::FocusReason>
               (QWindow *args,FocusReason args_1)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  FocusWindowEvent event;
  WindowSystemEvent local_58;
  int *piStack_40;
  QWindow *local_38;
  FocusReason FStack_30;
  undefined4 uStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::FocusWindowEvent,QWindow*,Qt::FocusReason>
              (args,args_1);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_00330dbe;
  }
  local_58._20_4_ = 0xaaaaaaaa;
  piStack_40 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QWindow *)&DAT_aaaaaaaaaaaaaaaa;
  FStack_30 = 0xaaaaaaaa;
  uStack_2c = 0xaaaaaaaa;
  local_58.type = FocusWindow;
  local_58.flags = 0;
  local_58.eventAccepted = true;
  local_58._17_3_ = 0xaaaaaa;
  local_58._vptr_WindowSystemEvent = (_func_int **)&PTR__FocusWindowEvent_007e96f8;
  if (args == (QWindow *)0x0) {
    piStack_40 = (int *)0x0;
  }
  else {
    piStack_40 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
  }
  local_38 = args;
  FStack_30 = args_1;
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(&local_58);
LAB_00330d7c:
    uVar4 = local_58.eventAccepted;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&local_58);
    if ((char)iVar3 != '\0') goto LAB_00330d7c;
    uVar4 = 0;
  }
  local_58._vptr_WindowSystemEvent = (_func_int **)&PTR__FocusWindowEvent_007e96f8;
  if (piStack_40 != (int *)0x0) {
    LOCK();
    *piStack_40 = *piStack_40 + -1;
    UNLOCK();
    if ((*piStack_40 == 0) && (piStack_40 != (int *)0x0)) {
      operator_delete(piStack_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar4;
  }
LAB_00330dbe:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}